

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P11Objects.cpp
# Opt level: O2

int __thiscall P11EDPrivateKeyObj::init(P11EDPrivateKeyObj *this,EVP_PKEY_CTX *ctx)

{
  map<unsigned_long,_P11Attribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_P11Attribute_*>_>_>
  *this_00;
  char cVar1;
  int iVar2;
  long lVar3;
  P11Attribute *this_01;
  P11Attribute *this_02;
  mapped_type *ppPVar4;
  int iVar5;
  undefined8 unaff_RBX;
  EVP_PKEY_CTX *ctx_00;
  OSAttribute setKeyType;
  
  iVar5 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if ((this->super_P11PrivateKeyObj).super_P11KeyObj.super_P11Object.field_0x43 != '\0') {
    return iVar5;
  }
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    cVar1 = (**(code **)(*(long *)ctx + 0x10))(ctx,0x100);
    if ((cVar1 == '\0') ||
       (lVar3 = (**(code **)(*(long *)ctx + 0x28))(ctx,0x100,0x80000000), lVar3 != 0x40)) {
      OSAttribute::OSAttribute(&setKeyType,0x40);
      (**(code **)(*(long *)ctx + 0x40))(ctx,0x100,&setKeyType);
      OSAttribute::~OSAttribute(&setKeyType);
    }
    iVar2 = P11PrivateKeyObj::init(&this->super_P11PrivateKeyObj,ctx);
    if ((char)iVar2 != '\0') {
      this_01 = (P11Attribute *)operator_new(0x28);
      P11AttrEcParams::P11AttrEcParams
                ((P11AttrEcParams *)this_01,
                 (this->super_P11PrivateKeyObj).super_P11KeyObj.super_P11Object.osobject,0x28);
      this_02 = (P11Attribute *)operator_new(0x28);
      ctx_00 = (EVP_PKEY_CTX *)
               (this->super_P11PrivateKeyObj).super_P11KeyObj.super_P11Object.osobject;
      P11AttrValue::P11AttrValue((P11AttrValue *)this_02,(OSObject *)ctx_00,0x69);
      iVar2 = P11Attribute::init(this_01,ctx_00);
      if (((char)iVar2 != '\0') && (iVar2 = P11Attribute::init(this_02,ctx_00), (char)iVar2 != '\0')
         ) {
        this_00 = &(this->super_P11PrivateKeyObj).super_P11KeyObj.super_P11Object.attributes;
        setKeyType._vptr_OSAttribute = (_func_int **)P11Attribute::getType(this_01);
        ppPVar4 = std::
                  map<unsigned_long,_P11Attribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_P11Attribute_*>_>_>
                  ::operator[](this_00,(key_type *)&setKeyType);
        *ppPVar4 = this_01;
        setKeyType._vptr_OSAttribute = (_func_int **)P11Attribute::getType(this_02);
        ppPVar4 = std::
                  map<unsigned_long,_P11Attribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_P11Attribute_*>_>_>
                  ::operator[](this_00,(key_type *)&setKeyType);
        *ppPVar4 = this_02;
        (this->super_P11PrivateKeyObj).super_P11KeyObj.super_P11Object.field_0x43 = 1;
        return iVar5;
      }
      softHSMLog(3,"init",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/P11Objects.cpp"
                 ,0x52c,"Could not initialize the attribute");
      (*this_01->_vptr_P11Attribute[1])(this_01);
      (*this_02->_vptr_P11Attribute[1])(this_02);
      return 0;
    }
  }
  return 0;
}

Assistant:

bool P11EDPrivateKeyObj::init(OSObject *inobject)
{
	if (initialized) return true;
	if (inobject == NULL) return false;

	if (!inobject->attributeExists(CKA_KEY_TYPE) || inobject->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_EC_EDWARDS) {
		OSAttribute setKeyType((unsigned long)CKK_EC_EDWARDS);
		inobject->setAttribute(CKA_KEY_TYPE, setKeyType);
	}

	// Create parent
	if (!P11PrivateKeyObj::init(inobject)) return false;

	// Create attributes
	P11Attribute* attrEcParams = new P11AttrEcParams(osobject,P11Attribute::ck4|P11Attribute::ck6);
	P11Attribute* attrValue = new P11AttrValue(osobject,P11Attribute::ck1|P11Attribute::ck4|P11Attribute::ck6|P11Attribute::ck7);

	// Initialize the attributes
	if
	(
		!attrEcParams->init() ||
		!attrValue->init()
	)
	{
		ERROR_MSG("Could not initialize the attribute");
		delete attrEcParams;
		delete attrValue;
		return false;
	}

	// Add them to the map
	attributes[attrEcParams->getType()] = attrEcParams;
	attributes[attrValue->getType()] = attrValue;

	initialized = true;
	return true;
}